

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateExtkeyFromParentKeyRequest,cfd::js::api::json::CreateExtkeyResponse,cfd::js::api::CreateExtkeyFromParentKeyRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_5b0;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_4f8 [4];
  JsonClassBase<cfd::js::api::json::CreateExtkeyResponse> local_4d8 [4];
  undefined1 local_4b8 [8];
  CreateExtkeyResponse res_2;
  undefined1 local_458 [8];
  CreateExtkeyResponseStruct response;
  CreateExtkeyFromParentKeyRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_e8 [8];
  CreateExtkeyFromParentKeyRequest req;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._192_8_ = call_function;
  CreateExtkeyFromParentKeyRequest::CreateExtkeyFromParentKeyRequest
            ((CreateExtkeyFromParentKeyRequest *)local_e8);
  core::JsonClassBase<cfd::js::api::json::CreateExtkeyFromParentKeyRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::CreateExtkeyFromParentKeyRequest> *)local_e8,
             request_message);
  CreateExtkeyFromParentKeyRequest::ConvertToStruct
            ((CreateExtkeyFromParentKeyRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (CreateExtkeyFromParentKeyRequest *)local_e8);
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&)>
  ::operator()((CreateExtkeyResponseStruct *)local_458,call_function,
               (CreateExtkeyFromParentKeyRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    CreateExtkeyResponse::CreateExtkeyResponse((CreateExtkeyResponse *)local_4b8);
    CreateExtkeyResponse::ConvertFromStruct
              ((CreateExtkeyResponse *)local_4b8,(CreateExtkeyResponseStruct *)local_458);
    core::JsonClassBase<cfd::js::api::json::CreateExtkeyResponse>::Serialize_abi_cxx11_(local_4d8);
    std::__cxx11::string::operator=((string *)this,(string *)local_4d8);
    std::__cxx11::string::~string((string *)local_4d8);
    CreateExtkeyResponse::~CreateExtkeyResponse((CreateExtkeyResponse *)local_4b8);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_5b0,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_4f8);
    std::__cxx11::string::operator=((string *)this,(string *)local_4f8);
    std::__cxx11::string::~string((string *)local_4f8);
    ErrorResponse::~ErrorResponse(&local_5b0);
  }
  res_2._87_1_ = 1;
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct((CreateExtkeyResponseStruct *)local_458);
  CreateExtkeyFromParentKeyRequestStruct::~CreateExtkeyFromParentKeyRequestStruct
            ((CreateExtkeyFromParentKeyRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CreateExtkeyFromParentKeyRequest::~CreateExtkeyFromParentKeyRequest
            ((CreateExtkeyFromParentKeyRequest *)local_e8);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}